

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_func_setup(jit_State *J)

{
  byte bVar1;
  GCproto *pGVar2;
  TRef *pTVar3;
  ulong uVar4;
  
  pGVar2 = J->pt;
  if ((pGVar2->flags & 8) != 0) {
    lj_trace_err(J,LJ_TRERR_CJITOFF);
  }
  if ((uint)pGVar2->framesize + J->baseslot < 0xfa) {
    bVar1 = pGVar2->numparams;
    uVar4 = (ulong)J->maxslot;
    if (J->maxslot < (uint)bVar1) {
      pTVar3 = J->base;
      do {
        pTVar3[uVar4] = 0x7fff;
        uVar4 = uVar4 + 1;
      } while ((uint)bVar1 != uVar4);
    }
    J->maxslot = (uint)bVar1;
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}